

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v10::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow
          (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this,size_t size)

{
  char *__src;
  size_t __n;
  char *__dest;
  ptrdiff_t _Num;
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (this->super_buffer<char>).capacity_;
  uVar1 = (uVar1 >> 1) + uVar1;
  uVar2 = size;
  if (((size <= uVar1) && (uVar2 = uVar1, (long)uVar1 < 0)) &&
     (uVar2 = 0x7fffffffffffffff, 0x7fffffffffffffff < size)) {
    uVar2 = size;
  }
  if ((long)uVar2 < 0) {
    std::__throw_bad_alloc();
  }
  __src = (this->super_buffer<char>).ptr_;
  __dest = (char *)operator_new(uVar2);
  __n = (this->super_buffer<char>).size_;
  if (__n != 0) {
    memmove(__dest,__src,__n);
  }
  (this->super_buffer<char>).ptr_ = __dest;
  (this->super_buffer<char>).capacity_ = uVar2;
  if (__src == this->store_) {
    return;
  }
  operator_delete(__src);
  return;
}

Assistant:

FMT_CONSTEXPR20 void grow(size_t size) override {
    detail::abort_fuzzing_if(size > 5000);
    const size_t max_size = std::allocator_traits<Allocator>::max_size(alloc_);
    size_t old_capacity = this->capacity();
    size_t new_capacity = old_capacity + old_capacity / 2;
    if (size > new_capacity)
      new_capacity = size;
    else if (new_capacity > max_size)
      new_capacity = size > max_size ? size : max_size;
    T* old_data = this->data();
    T* new_data =
        std::allocator_traits<Allocator>::allocate(alloc_, new_capacity);
    // Suppress a bogus -Wstringop-overflow in gcc 13.1 (#3481).
    detail::assume(this->size() <= new_capacity);
    // The following code doesn't throw, so the raw pointer above doesn't leak.
    std::uninitialized_copy_n(old_data, this->size(), new_data);
    this->set(new_data, new_capacity);
    // deallocate must not throw according to the standard, but even if it does,
    // the buffer already uses the new storage and will deallocate it in
    // destructor.
    if (old_data != store_) alloc_.deallocate(old_data, old_capacity);
  }